

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O1

bool __thiscall psy::C::TypeChecker::isAssignable(TypeChecker *this,SyntaxNode *node,Type *ty)

{
  TypeKind TVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TagDeclarationSymbol *this_00;
  undefined4 extraout_var_01;
  SyntaxToken *this_01;
  MemberDeclarationSymbol **membDecl;
  pointer ppMVar4;
  bool bVar5;
  Members local_b0;
  SyntaxToken local_98;
  SyntaxToken local_60;
  
  while (TVar1 = Type::kind(ty), TVar1 == TypedefName) {
    iVar3 = (*ty->_vptr_Type[0xb])(ty);
    ty = TypedefNameType::resolvedSynonymizedType((TypedefNameType *)CONCAT44(extraout_var,iVar3));
  }
  if (TVar1 == Array) {
    SyntaxNode::lastToken(&local_98,node);
    DiagnosticsReporter::CannotAssignToExpressionOfArrayType(&this->diagReporter_,&local_98);
    this_01 = &local_98;
  }
  else {
    if (TVar1 == Tag) {
      iVar3 = (*ty->_vptr_Type[0xd])(ty);
      this_00 = TagType::declaration((TagType *)CONCAT44(extraout_var_00,iVar3));
      if (this_00 == (TagDeclarationSymbol *)0x0) {
        return false;
      }
      TagDeclarationSymbol::members(&local_b0,this_00);
      for (ppMVar4 = local_b0.
                     super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar5 = ppMVar4 ==
                  local_b0.
                  super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish, !bVar5; ppMVar4 = ppMVar4 + 1) {
        iVar3 = (*((*ppMVar4)->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x26])();
        bVar2 = isAssignable(this,node,(Type *)CONCAT44(extraout_var_01,iVar3));
        if (!bVar2) break;
      }
      if (local_b0.
          super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.
                        super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        return bVar5;
      }
      return bVar5;
    }
    if (TVar1 != Qualified) {
      return true;
    }
    SyntaxNode::lastToken(&local_60,node);
    DiagnosticsReporter::CannotAssignToExpressionOfConstQualifiedType
              (&this->diagReporter_,&local_60);
    this_01 = &local_60;
  }
  SyntaxToken::~SyntaxToken(this_01);
  return false;
}

Assistant:

bool TypeChecker::isAssignable(const SyntaxNode* node, const Type* ty)
{
    switch (ty->kind()) {
        case TypeKind::Qualified:
            diagReporter_.CannotAssignToExpressionOfConstQualifiedType(node->lastToken());
            return false;
        case TypeKind::TypedefName:
            return isAssignable(node, ty->asTypedefNameType()->resolvedSynonymizedType());
        case TypeKind::Array:
            diagReporter_.CannotAssignToExpressionOfArrayType(node->lastToken());
            return false;
        case TypeKind::Tag: {
            auto tagTy = ty->asTagType();
            auto tagTyDecl = tagTy->declaration();
            if (!tagTyDecl)
                return false;
            for (const auto& membDecl : tagTyDecl->members()) {
                auto membTy = membDecl->type();
                if (!isAssignable(node, membTy))
                    return false;
            }
            return true;
        }
        default:
            return true;
    }
}